

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberToString.h
# Opt level: O1

json_string *
NumberToString::_uitoa<unsigned_short>(json_string *__return_storage_ptr__,unsigned_short val)

{
  bool bVar1;
  ulong in_RAX;
  size_t sVar2;
  ulong uVar3;
  undefined6 in_register_00000032;
  char *__s;
  char num_str_result [7];
  undefined8 uStack_18;
  
  __s = (char *)((long)&uStack_18 + 7);
  uStack_18 = in_RAX & 0xffffffffffffff;
  uVar3 = CONCAT62(in_register_00000032,val) & 0xffffffff;
  do {
    __s[-1] = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
    __s = __s + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

static json_string _uitoa(T val) json_nothrow {
		  #ifdef JSON_LESS_MEMORY
			 json_auto<json_char> s(getLenSize<sizeof(T)>::GETLEN);
		  #else
			 json_char num_str_result[getLenSize<sizeof(T)>::GETLEN];
		  #endif
		  num_str_result[getLenSize<sizeof(T)>::GETLEN - 1] = JSON_TEXT('\0'); //null terminator
		  json_char * runner = &num_str_result[getLenSize<sizeof(T)>::GETLEN - 2];

		  //create the string
		  START_MEM_SCOPE
			 unsigned long value = (unsigned long)val;
			 do {
				*runner-- = (json_char)(value % 10) + JSON_TEXT('0');
			 } while(value /= 10);
		  END_MEM_SCOPE

		  return json_string(runner + 1);
	   }